

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

void utrie_compact(UNewTrie *trie,UBool overlap,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  bool bVar4;
  int local_44;
  int local_30;
  int32_t local_2c;
  int32_t overlapStart;
  int32_t newStart;
  int32_t start;
  int32_t i;
  UErrorCode *pErrorCode_local;
  UBool overlap_local;
  UNewTrie *trie_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*pErrorCode), UVar1 == '\0')) {
    if (trie == (UNewTrie *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (trie->isCompacted == '\0') {
      _findUnusedBlocks(trie);
      if (trie->isLatin1Linear == '\0') {
        local_30 = 0x20;
      }
      else {
        local_30 = 0x120;
      }
      local_2c = 0x20;
      overlapStart = 0x20;
      do {
        while( true ) {
          while( true ) {
            if (trie->dataLength <= overlapStart) {
              for (newStart = 0; newStart < trie->indexLength; newStart = newStart + 1) {
                if (trie->index[newStart] < 0) {
                  local_44 = -trie->index[newStart];
                }
                else {
                  local_44 = trie->index[newStart];
                }
                trie->index[newStart] = trie->map[local_44 >> 5];
              }
              trie->dataLength = local_2c;
              return;
            }
            iVar3 = overlapStart >> 5;
            if (-1 < trie->map[iVar3]) break;
            overlapStart = overlapStart + 0x20;
          }
          if (local_30 <= overlapStart) break;
LAB_003d8a21:
          if ((overlap == '\0') || (overlapStart < local_30)) {
            newStart = 0;
          }
          else {
            newStart = 0x1c;
            while( true ) {
              bVar4 = false;
              if (0 < newStart) {
                UVar1 = equal_uint32(trie->data + (local_2c - newStart),trie->data + overlapStart,
                                     newStart);
                bVar4 = UVar1 == '\0';
              }
              if (!bVar4) break;
              newStart = newStart + -4;
            }
          }
          if (newStart < 1) {
            if (local_2c < overlapStart) {
              trie->map[iVar3] = local_2c;
              for (newStart = 0x20; 0 < newStart; newStart = newStart + -1) {
                trie->data[local_2c] = trie->data[overlapStart];
                local_2c = local_2c + 1;
                overlapStart = overlapStart + 1;
              }
            }
            else {
              trie->map[iVar3] = overlapStart;
              local_2c = local_2c + 0x20;
              overlapStart = local_2c;
            }
          }
          else {
            trie->map[iVar3] = local_2c - newStart;
            overlapStart = newStart + overlapStart;
            for (newStart = 0x20 - newStart; 0 < newStart; newStart = newStart + -1) {
              trie->data[local_2c] = trie->data[overlapStart];
              local_2c = local_2c + 1;
              overlapStart = overlapStart + 1;
            }
          }
        }
        iVar2 = 0x20;
        if (overlap != '\0') {
          iVar2 = 4;
        }
        iVar2 = _findSameDataBlock(trie->data,local_2c,overlapStart,iVar2);
        if (iVar2 < 0) goto LAB_003d8a21;
        trie->map[iVar3] = iVar2;
        overlapStart = overlapStart + 0x20;
      } while( true );
    }
  }
  return;
}

Assistant:

static void
utrie_compact(UNewTrie *trie, UBool overlap, UErrorCode *pErrorCode) {
    int32_t i, start, newStart, overlapStart;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }

    /* valid, uncompacted trie? */
    if(trie==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if(trie->isCompacted) {
        return; /* nothing left to do */
    }

    /* compaction */

    /* initialize the index map with "block is used/unused" flags */
    _findUnusedBlocks(trie);

    /* if Latin-1 is preallocated and linear, then do not compact Latin-1 data */
    if(trie->isLatin1Linear && UTRIE_SHIFT<=8) {
        overlapStart=UTRIE_DATA_BLOCK_LENGTH+256;
    } else {
        overlapStart=UTRIE_DATA_BLOCK_LENGTH;
    }

    newStart=UTRIE_DATA_BLOCK_LENGTH;
    for(start=newStart; start<trie->dataLength;) {
        /*
         * start: index of first entry of current block
         * newStart: index where the current block is to be moved
         *           (right after current end of already-compacted data)
         */

        /* skip blocks that are not used */
        if(trie->map[start>>UTRIE_SHIFT]<0) {
            /* advance start to the next block */
            start+=UTRIE_DATA_BLOCK_LENGTH;

            /* leave newStart with the previous block! */
            continue;
        }

        /* search for an identical block */
        if( start>=overlapStart &&
            (i=_findSameDataBlock(trie->data, newStart, start,
                            overlap ? UTRIE_DATA_GRANULARITY : UTRIE_DATA_BLOCK_LENGTH))
             >=0
        ) {
            /* found an identical block, set the other block's index value for the current block */
            trie->map[start>>UTRIE_SHIFT]=i;

            /* advance start to the next block */
            start+=UTRIE_DATA_BLOCK_LENGTH;

            /* leave newStart with the previous block! */
            continue;
        }

        /* see if the beginning of this block can be overlapped with the end of the previous block */
        if(overlap && start>=overlapStart) {
            /* look for maximum overlap (modulo granularity) with the previous, adjacent block */
            for(i=UTRIE_DATA_BLOCK_LENGTH-UTRIE_DATA_GRANULARITY;
                i>0 && !equal_uint32(trie->data+(newStart-i), trie->data+start, i);
                i-=UTRIE_DATA_GRANULARITY) {}
        } else {
            i=0;
        }

        if(i>0) {
            /* some overlap */
            trie->map[start>>UTRIE_SHIFT]=newStart-i;

            /* move the non-overlapping indexes to their new positions */
            start+=i;
            for(i=UTRIE_DATA_BLOCK_LENGTH-i; i>0; --i) {
                trie->data[newStart++]=trie->data[start++];
            }
        } else if(newStart<start) {
            /* no overlap, just move the indexes to their new positions */
            trie->map[start>>UTRIE_SHIFT]=newStart;
            for(i=UTRIE_DATA_BLOCK_LENGTH; i>0; --i) {
                trie->data[newStart++]=trie->data[start++];
            }
        } else /* no overlap && newStart==start */ {
            trie->map[start>>UTRIE_SHIFT]=start;
            newStart+=UTRIE_DATA_BLOCK_LENGTH;
            start=newStart;
        }
    }

    /* now adjust the index (stage 1) table */
    for(i=0; i<trie->indexLength; ++i) {
        trie->index[i]=trie->map[ABS(trie->index[i])>>UTRIE_SHIFT];
    }

#ifdef UTRIE_DEBUG
    /* we saved some space */
    printf("compacting trie: count of 32-bit words %lu->%lu\n",
            (long)trie->dataLength, (long)newStart);
#endif

    trie->dataLength=newStart;
}